

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_unsigned_long>
google::protobuf::internal::VarintParseSlow64(char *p,uint32_t res32)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  pair<const_char_*,_unsigned_long> pVar4;
  
  uVar3 = (ulong)res32;
  pcVar1 = p + 3;
  lVar2 = 0xe;
  do {
    uVar3 = ((ulong)(byte)pcVar1[-1] - 1 << ((byte)lVar2 & 0x3f)) + uVar3;
    if (-1 < pcVar1[-1]) goto LAB_0038aa2e;
    pcVar1 = pcVar1 + 1;
    lVar2 = lVar2 + 7;
  } while (lVar2 != 0x46);
  pcVar1 = (char *)0x0;
  uVar3 = 0;
LAB_0038aa2e:
  pVar4.second = uVar3;
  pVar4.first = pcVar1;
  return pVar4;
}

Assistant:

std::pair<const char*, uint64_t> VarintParseSlow64(const char* p,
                                                   uint32_t res32) {
  uint64_t res = res32;
  for (std::uint32_t i = 2; i < 10; i++) {
    uint64_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}